

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::OpExtInstWithForwardReferenceFixupPass::Process
          (OpExtInstWithForwardReferenceFixupPass *this)

{
  Module *pMVar1;
  IRContext *this_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Op OVar5;
  Operand *this_01;
  size_type sVar6;
  uint uVar7;
  __node_base _Var8;
  Instruction *inst;
  Instruction *this_02;
  bool bVar9;
  bool bVar10;
  uint32_t id;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  debug_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_ids;
  Status local_dc;
  uint32_t local_d8;
  uint local_d4;
  IRContext *local_d0;
  string local_c8;
  Instruction *local_a8;
  undefined1 local_a0 [56];
  __node_base local_58;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_a0._0_8_ =
       *(Instruction **)
        ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_a0._8_8_ =
       (long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8;
  anon_unknown_11::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&stack0xffffffffffffff98,
             (IteratorRange<spvtools::opt::InstructionList::iterator> *)local_a0);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_c8._M_dataplus._M_p =
       *(pointer *)
        ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
        );
  local_c8._M_string_length =
       (long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8;
  anon_unknown_11::gatherResultIds
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_a0,(IteratorRange<spvtools::opt::InstructionList::iterator> *)&local_c8);
  if (local_58._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_58._M_nxt;
    do {
      local_d8 = *(uint32_t *)&_Var8._M_nxt[1]._M_nxt;
      local_c8._M_dataplus._M_p = (pointer)local_a0;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((Instruction *)local_a0,
                 (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_d8,&local_c8);
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  local_d0 = (this->super_Pass).context_;
  pMVar1 = (local_d0->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_02 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  local_a8 = (Instruction *)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             8);
  if (this_02 == local_a8) {
    uVar7 = 0;
    local_dc = Failure;
  }
  else {
    local_dc = Failure;
    uVar7 = 0;
    do {
      if ((this_02->opcode_ == OpExtInstWithForwardRefsKHR) || (this_02->opcode_ == OpExtInst)) {
        uVar3 = 0;
        if (this_02->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
        }
        local_c8._M_dataplus._M_p = &stack0xffffffffffffff98;
        local_d8 = uVar3;
        local_d4 = uVar7;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  (local_c8._M_dataplus._M_p,
                   (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_d8,&local_c8);
        uVar7 = (this_02->has_result_id_ & 1) + 1;
        if (this_02->has_type_id_ == false) {
          uVar7 = (uint)this_02->has_result_id_;
        }
        uVar7 = (int)((ulong)((long)(this_02->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar7;
        bVar9 = uVar7 != 0;
        if (bVar9) {
          uVar3 = 0;
          do {
            this_01 = Instruction::GetInOperand(this_02,uVar3);
            bVar2 = spvIsIdType(this_01->type);
            bVar10 = false;
            if (bVar2) {
              uVar4 = Operand::AsId(this_01);
              local_c8._M_dataplus._M_p._0_4_ = uVar4;
              sVar6 = std::
                      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)local_a0,(key_type_conflict *)&local_c8);
              if (sVar6 != 0) {
                uVar4 = Operand::AsId(this_01);
                local_c8._M_dataplus._M_p._0_4_ = uVar4;
                sVar6 = std::
                        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)&stack0xffffffffffffff98,(key_type_conflict *)&local_c8);
                bVar10 = sVar6 == 0;
              }
            }
            if (bVar10) break;
            uVar3 = uVar3 + 1;
            bVar9 = uVar3 < uVar7;
          } while (uVar3 != uVar7);
        }
        uVar7 = CONCAT31((int3)(local_d4 >> 8),(byte)local_d4 | bVar9);
        if (bVar9 == false) {
LAB_0059b6ab:
          OVar5 = OpExtInst;
          if (this_02->opcode_ == OpExtInst) goto LAB_0059b6ce;
        }
        else {
          OVar5 = OpExtInstWithForwardRefsKHR;
          if (this_02->opcode_ == OpExtInstWithForwardRefsKHR) {
            if (bVar9 != false) goto LAB_0059b6ce;
            goto LAB_0059b6ab;
          }
        }
        this_02->opcode_ = OVar5;
        IRContext::AnalyzeUses(local_d0,this_02);
        local_dc = 1;
      }
LAB_0059b6ce:
      this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_02 != local_a8);
  }
  this_00 = local_d0;
  if ((local_d0->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(local_d0);
  }
  bVar9 = EnumSet<spvtools::Extension>::contains
                    (&((this_00->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->extensions_,kSPV_KHR_relaxed_extended_instruction);
  if (((bVar9 ^ (byte)uVar7) & 1) != 0) {
    if ((uVar7 & 1) == 0) {
      IRContext::RemoveExtension(this_00,kSPV_KHR_relaxed_extended_instruction);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"SPV_KHR_relaxed_extended_instruction","");
      IRContext::AddExtension(this_00,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    local_dc = 1;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&stack0xffffffffffffff98);
  return local_dc ^ SuccessWithoutChange;
}

Assistant:

Pass::Status OpExtInstWithForwardReferenceFixupPass::Process() {
  std::unordered_set<uint32_t> seen_ids =
      gatherResultIds(get_module()->ext_inst_imports());
  std::unordered_set<uint32_t> debug_ids =
      gatherResultIds(get_module()->ext_inst_debuginfo());
  for (uint32_t id : seen_ids) debug_ids.insert(id);

  bool moduleChanged = false;
  bool hasAtLeastOneForwardReference = false;
  IRContext* ctx = context();
  for (Instruction& inst : get_module()->ext_inst_debuginfo()) {
    if (inst.opcode() != spv::Op::OpExtInst &&
        inst.opcode() != spv::Op::OpExtInstWithForwardRefsKHR)
      continue;

    seen_ids.insert(inst.result_id());
    bool hasForwardReferences = HasForwardReference(inst, debug_ids, seen_ids);
    hasAtLeastOneForwardReference |= hasForwardReferences;

    if (ReplaceOpcodeIfRequired(inst, hasForwardReferences)) {
      moduleChanged = true;
      ctx->AnalyzeUses(&inst);
    }
  }

  if (hasAtLeastOneForwardReference !=
      ctx->get_feature_mgr()->HasExtension(
          kSPV_KHR_relaxed_extended_instruction)) {
    if (hasAtLeastOneForwardReference)
      ctx->AddExtension("SPV_KHR_relaxed_extended_instruction");
    else
      ctx->RemoveExtension(Extension::kSPV_KHR_relaxed_extended_instruction);
    moduleChanged = true;
  }

  return moduleChanged ? Status::SuccessWithChange
                       : Status::SuccessWithoutChange;
}